

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadSubdivMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *pvVar1;
  string *psVar2;
  XML *this_00;
  SubdivMeshNode *pSVar3;
  undefined8 uVar4;
  bool bVar5;
  RTCSubdivisionMode RVar6;
  SubdivMeshNode *in_RCX;
  pointer in_RDX;
  uchar *sig;
  size_t i;
  ulong uVar7;
  EVP_PKEY_CTX *ctx;
  uchar *in_R8;
  size_t in_R9;
  Ref<embree::XML> animation;
  Ref<embree::XML> animation_1;
  Ref<embree::SceneGraph::MaterialNode> material;
  Ref<embree::XML> local_b0;
  string local_a8;
  SubdivMeshNode *local_88;
  _Alloc_hider local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [56];
  
  psVar2 = *(string **)in_RDX;
  local_80._M_p = in_RDX;
  std::__cxx11::string::string((string *)&local_a8,"material",(allocator *)&local_b0);
  XML::child((XML *)local_68,psVar2);
  loadMaterial((XMLLoader *)(local_68 + 0x28),xml);
  if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  local_88 = (SubdivMeshNode *)::operator_new(0x1b0);
  local_68._32_8_ = local_68._40_8_;
  local_68._48_8_ = this;
  if ((_Base_ptr)local_68._40_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._40_8_ + 0x10))();
  }
  pSVar3 = local_88;
  SceneGraph::SubdivMeshNode::SubdivMeshNode
            (local_88,(Ref<embree::SceneGraph::MaterialNode> *)(local_68 + 0x20),
             (BBox1f)0x3f80000000000000,0);
  (*(pSVar3->super_Node).super_RefCount._vptr_RefCount[2])(pSVar3);
  if ((_Base_ptr)local_68._32_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._32_8_ + 0x18))();
  }
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"animated_positions",(allocator *)local_68);
  XML::childOpt((XML *)&local_b0,psVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  pvVar1 = &local_88->positions;
  if (local_b0.ptr == (XML *)0x0) {
    psVar2 = *(string **)local_80._M_p;
    std::__cxx11::string::string((string *)local_68,"positions",(allocator *)(local_78 + 0xf));
    XML::childOpt((XML *)local_78,psVar2);
    loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_78);
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)pvVar1,
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               &local_a8);
    alignedFree((void *)local_a8.field_2._8_8_);
    local_a8.field_2._8_8_ = (void *)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    if ((XML *)local_78._0_8_ != (XML *)0x0) {
      (*((RefCount *)local_78._0_8_)->_vptr_RefCount[3])();
    }
    std::__cxx11::string::~string((string *)local_68);
    this_00 = *(XML **)local_80._M_p;
    std::__cxx11::string::string((string *)&local_a8,"positions2",(allocator *)local_68);
    bVar5 = XML::hasChild(this_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar5) {
      psVar2 = *(string **)local_80._M_p;
      std::__cxx11::string::string((string *)local_68,"positions2",(allocator *)(local_78 + 0xf));
      XML::childOpt((XML *)local_78,psVar2);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_78);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)pvVar1,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8.field_2._8_8_ = (void *)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      if ((XML *)local_78._0_8_ != (XML *)0x0) {
        (*((RefCount *)local_78._0_8_)->_vptr_RefCount[3])();
      }
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  else {
    for (uVar7 = 0;
        uVar7 < (ulong)((long)((local_b0.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)((local_b0.ptr)->children).
                              super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
      XML::child((XML *)local_68,(size_t)local_b0.ptr);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,(Ref<embree::XML> *)local_68);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)pvVar1,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8.field_2._8_8_ = (void *)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))();
      }
    }
  }
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"animated_normals",(allocator *)&local_b0);
  XML::childOpt((XML *)local_68,psVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((_func_int **)local_68._0_8_ == (_func_int **)0x0) {
    psVar2 = *(string **)local_80._M_p;
    std::__cxx11::string::string((string *)&local_a8,"normals",(allocator *)local_78);
    XML::childOpt((XML *)&local_b0,psVar2);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_b0.ptr != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      if ((element_type *)local_a8._M_string_length != (element_type *)0x0) {
        pvVar1 = &local_88->normals;
        for (uVar7 = 0; in_RCX = local_88,
            uVar7 < (ulong)((long)(local_88->positions).
                                  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_88->positions).
                                  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1
            ) {
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back(pvVar1,(value_type *)&local_a8);
        }
      }
      alignedFree((void *)local_a8.field_2._8_8_);
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    if ((_func_int **)local_68._0_8_ == (_func_int **)0x0) goto LAB_00170b5d;
  }
  else {
    pvVar1 = &local_88->normals;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)*(_func_int **)(local_68._0_8_ + 0x88) -
                        (long)*(_func_int **)(local_68._0_8_ + 0x80) >> 3); uVar7 = uVar7 + 1) {
      XML::child((XML *)&local_b0,local_68._0_8_);
      loadVec3faArray((avector<Vec3fa> *)&local_a8,(XMLLoader *)xml,&local_b0);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)pvVar1,
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_a8);
      alignedFree((void *)local_a8.field_2._8_8_);
      local_a8.field_2._8_8_ = (void *)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      if (local_b0.ptr != (XML *)0x0) {
        (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
  }
  (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))(local_68._0_8_);
LAB_00170b5d:
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"texcoords",(allocator *)local_78);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec2fArray((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_68,
                 (XMLLoader *)xml,&local_b0);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::_M_move_assign
            (&local_88->texcoords,
             (_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_68);
  std::_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::~_Vector_base
            ((_Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)local_68);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"position_indices",(allocator *)&local_b0);
  XML::childOpt((XML *)local_68,psVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_68);
    pSVar3 = local_88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&local_88->position_indices,&local_a8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
    RVar6 = parseSubdivMode((Ref<embree::XML> *)local_68);
    pSVar3->position_subdiv_mode = RVar6;
    if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))();
    }
  }
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"normal_indices",(allocator *)&local_b0);
  XML::childOpt((XML *)local_68,psVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_68);
    pSVar3 = local_88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&local_88->normal_indices,&local_a8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
    RVar6 = parseSubdivMode((Ref<embree::XML> *)local_68);
    pSVar3->normal_subdiv_mode = RVar6;
    if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))();
    }
  }
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"texcoord_indices",(allocator *)&local_b0);
  XML::childOpt((XML *)local_68,psVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
    loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(XMLLoader *)xml,
                  (Ref<embree::XML> *)local_68);
    pSVar3 = local_88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&local_88->texcoord_indices,&local_a8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
    RVar6 = parseSubdivMode((Ref<embree::XML> *)local_68);
    pSVar3->texcoord_subdiv_mode = RVar6;
    if ((_func_int **)local_68._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_68._0_8_ + 0x18))();
    }
  }
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"faces",(allocator *)local_78);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,(XMLLoader *)xml,
                &local_b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&local_88->verticesPerFace,
             (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"holes",(allocator *)local_78);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,(XMLLoader *)xml,
                &local_b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&local_88->holes,(_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68)
  ;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"edge_creases",(allocator *)local_78);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadVec2iArray((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)local_68,
                 (XMLLoader *)xml,&local_b0);
  std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::_M_move_assign
            (&local_88->edge_creases,
             (_Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)local_68);
  std::_Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::~_Vector_base
            ((_Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)local_68);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"edge_crease_weights",(allocator *)local_78);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadFloatArray((vector<float,_std::allocator<float>_> *)local_68,(XMLLoader *)xml,&local_b0);
  std::vector<float,_std::allocator<float>_>::_M_move_assign
            (&local_88->edge_crease_weights,(_Vector_base<float,_std::allocator<float>_> *)local_68)
  ;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_68);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"vertex_creases",(allocator *)local_78);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,(XMLLoader *)xml,
                &local_b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&local_88->vertex_creases,
             (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  psVar2 = *(string **)local_80._M_p;
  std::__cxx11::string::string((string *)&local_a8,"vertex_crease_weights",(allocator *)local_78);
  XML::childOpt((XML *)&local_b0,psVar2);
  loadFloatArray((vector<float,_std::allocator<float>_> *)local_68,(XMLLoader *)xml,&local_b0);
  ctx = (EVP_PKEY_CTX *)local_68;
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&local_88->vertex_crease_weights);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)local_68);
  if (local_b0.ptr != (XML *)0x0) {
    (*((local_b0.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_a8);
  pSVar3 = local_88;
  SceneGraph::SubdivMeshNode::verify(local_88,ctx,sig,(size_t)in_RCX,in_R8,in_R9);
  uVar4 = local_68._48_8_;
  *(SubdivMeshNode **)local_68._48_8_ = pSVar3;
  (*(pSVar3->super_Node).super_RefCount._vptr_RefCount[2])(pSVar3);
  (*(pSVar3->super_Node).super_RefCount._vptr_RefCount[3])(pSVar3);
  if ((_Base_ptr)local_68._40_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._40_8_ + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)uVar4;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadSubdivMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions2")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
    
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    if (Ref<XML> child = xml->childOpt("position_indices")) {
      mesh->position_indices = loadUIntArray(child);
      mesh->position_subdiv_mode = parseSubdivMode(child);
    }
    if (Ref<XML> child = xml->childOpt("normal_indices")) {
      mesh->normal_indices   = loadUIntArray(child);
      mesh->normal_subdiv_mode = parseSubdivMode(child);
    }
    if (Ref<XML> child = xml->childOpt("texcoord_indices")) {
      mesh->texcoord_indices = loadUIntArray(child);
      mesh->texcoord_subdiv_mode = parseSubdivMode(child);
    }

    mesh->verticesPerFace  = loadUIntArray(xml->childOpt("faces"));
    mesh->holes            = loadUIntArray(xml->childOpt("holes"));
    mesh->edge_creases     = loadVec2iArray(xml->childOpt("edge_creases"));
    mesh->edge_crease_weights = loadFloatArray(xml->childOpt("edge_crease_weights"));
    mesh->vertex_creases      = loadUIntArray(xml->childOpt("vertex_creases"));
    mesh->vertex_crease_weights = loadFloatArray(xml->childOpt("vertex_crease_weights"));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }